

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutPool.h
# Opt level: O1

void __thiscall HighsCutPool::resetAge(HighsCutPool *this,HighsInt cut)

{
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *this_00;
  pointer psVar1;
  int *piVar2;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_std::_Rb_tree_iterator<std::pair<int,_int>_>_>
  pVar3;
  HighsInt local_24;
  key_type local_20;
  
  psVar1 = (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < psVar1[cut]) {
    local_24 = cut;
    if ((this->matrix_).colsLinked.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start[cut] != '\0') {
      this_00 = &this->propRows;
      local_20.first = (int)psVar1[cut];
      local_20.second = cut;
      pVar3 = std::
              _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              ::equal_range(&this_00->_M_t,&local_20);
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
      local_20.first = 0;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_emplace_unique<int,int&>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)this_00,&local_20.first,&local_24);
    }
    psVar1 = (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->ageDistribution).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2[psVar1[local_24]] = piVar2[psVar1[local_24]] + -1;
    *piVar2 = *piVar2 + 1;
    psVar1[local_24] = 0;
  }
  return;
}

Assistant:

void resetAge(HighsInt cut) {
    if (ages_[cut] > 0) {
      if (matrix_.columnsLinked(cut)) {
        propRows.erase(std::make_pair(ages_[cut], cut));
        propRows.emplace(0, cut);
      }
      ageDistribution[ages_[cut]] -= 1;
      ageDistribution[0] += 1;
      ages_[cut] = 0;
    }
  }